

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkSets.c
# Opt level: O3

uint Lpk_MapSuppRedDecSelect(Lpk_Man_t *p,uint *pTruth,int nVars,int *piVar,int *piVarReused)

{
  char cVar1;
  int iVar2;
  void **ppvVar3;
  uint *pIn;
  uint *pTruth_00;
  uint *pTruth_01;
  Lpk_Set_t *pLVar4;
  Kit_DsdNtk_t *pKVar5;
  Kit_DsdNtk_t *p_00;
  Kit_DsdNtk_t *p_01;
  uint uVar6;
  Vec_Int_t *pVVar7;
  Lpk_Set_t *pLVar8;
  Vec_Int_t *pVVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int nSets;
  uint local_78;
  int local_74;
  Vec_Int_t *local_70;
  Vec_Int_t *local_68;
  uint *local_60;
  uint *local_58;
  uint *local_50;
  Lpk_Man_t *local_48;
  uint *local_40;
  uint *local_38;
  
  iVar2 = p->vTtNodes->nSize;
  local_60 = pTruth;
  if ((iVar2 < 1) || (iVar2 == 1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pVVar7 = p->vSets[0];
  pVVar9 = p->vSets[1];
  ppvVar3 = p->vTtNodes->pArray;
  local_38 = (uint *)*ppvVar3;
  local_40 = (uint *)ppvVar3[1];
  iVar2 = p->pPars->fVeryVerbose;
  local_58 = (uint *)piVarReused;
  local_50 = (uint *)piVar;
  local_48 = p;
  if (iVar2 != 0) {
    puts("\nExploring support-reducing bound-sets of function:");
    Kit_DsdPrintFromTruth(local_60,nVars);
  }
  local_78 = 0;
  local_74 = nVars;
  if (0 < nVars) {
    iVar13 = 0;
    local_70 = pVVar7;
    local_68 = pVVar9;
    do {
      if (iVar2 != 0) {
        printf("Evaluating variable %c:\n",(ulong)(iVar13 + 0x61));
      }
      pTruth_01 = local_38;
      pIn = local_60;
      Kit_TruthCofactor0New(local_38,local_60,nVars,iVar13);
      pTruth_00 = local_40;
      Kit_TruthCofactor1New(local_40,pIn,nVars,iVar13);
      pKVar5 = Kit_DsdDecompose(pTruth_01,nVars);
      p_00 = Kit_DsdDecompose(pTruth_00,nVars);
      p_01 = Kit_DsdExpand(pKVar5);
      Kit_DsdNtkFree(pKVar5);
      pKVar5 = Kit_DsdExpand(p_00);
      Kit_DsdNtkFree(p_00);
      pVVar7 = local_70;
      if (iVar2 == 0) {
        Lpk_ComputeSets(p_01,local_70);
        pVVar9 = local_68;
        Lpk_ComputeSets(pKVar5,local_68);
      }
      else {
        Kit_DsdPrint(_stdout,p_01);
        Kit_DsdPrint(_stdout,pKVar5);
        pVVar7 = local_70;
        Lpk_ComputeSets(p_01,local_70);
        pVVar9 = local_68;
        Lpk_ComputeSets(pKVar5,local_68);
        Lpk_PrintSets(pVVar7);
        Lpk_PrintSets(pVVar9);
      }
      Kit_DsdNtkFree(p_01);
      Kit_DsdNtkFree(pKVar5);
      nVars = local_74;
      Lpk_ComposeSets(pVVar7,pVVar9,local_74,iVar13,Lpk_MapSuppRedDecSelect::pStore,(int *)&local_78
                      ,0x100);
      iVar13 = iVar13 + 1;
    } while (nVars != iVar13);
  }
  uVar6 = local_78;
  if (iVar2 != 0) {
    putchar(10);
    uVar6 = local_78;
    uVar11 = (ulong)local_78;
    if ((int)local_78 < 1) {
      Lpk_MapSuppRedDecSelect::pSetBest = (Lpk_Set_t *)0x0;
      goto LAB_004ee7e7;
    }
    pLVar8 = Lpk_MapSuppRedDecSelect::pStore;
    uVar14 = 0;
    do {
      Lpk_MapSuppPrintSet(pLVar8,(int)uVar14);
      uVar14 = uVar14 + 1;
      pLVar8 = pLVar8 + 1;
    } while (uVar11 != uVar14);
  }
  Lpk_MapSuppRedDecSelect::pSetBest = (Lpk_Set_t *)0x0;
  if (0 < (int)uVar6) {
    uVar11 = (ulong)uVar6;
    pLVar8 = (Lpk_Set_t *)0x0;
    iVar13 = 0;
    pLVar4 = Lpk_MapSuppRedDecSelect::pStore;
    do {
      Lpk_MapSuppRedDecSelect::pSet = pLVar4;
      iVar12 = (int)Lpk_MapSuppRedDecSelect::pSet->Size;
      if (iVar13 < iVar12 && iVar12 < local_48->pPars->nLutSize) {
        pLVar8 = Lpk_MapSuppRedDecSelect::pSet;
        iVar13 = iVar12;
        Lpk_MapSuppRedDecSelect::pSetBest = Lpk_MapSuppRedDecSelect::pSet;
      }
      uVar11 = uVar11 - 1;
      pLVar4 = Lpk_MapSuppRedDecSelect::pSet + 1;
    } while (uVar11 != 0);
    if (pLVar8 != (Lpk_Set_t *)0x0) {
      if (iVar2 != 0) {
        puts("Selected the following subset:");
        Lpk_MapSuppPrintSet(Lpk_MapSuppRedDecSelect::pSetBest,
                            (int)((ulong)(Lpk_MapSuppRedDecSelect::pSetBest + -0x129514) >> 2) *
                            -0x55555555);
        pLVar8 = Lpk_MapSuppRedDecSelect::pSetBest;
      }
      if (0x20 < local_74) {
        __assert_fail("nBits <= 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kit.h"
                      ,0xe4,"unsigned int Kit_BitMask(int)");
      }
      cVar1 = pLVar8->iVar;
      uVar6 = -1 << ((byte)local_74 & 0x1f) | (pLVar8->uSubset1 | pLVar8->uSubset0) >> 0x10 |
              1 << ((int)cVar1 & 0x1fU);
      if (uVar6 == 0xffffffff) {
        __assert_fail("Entry",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkSets.c"
                      ,0x1b0,
                      "unsigned int Lpk_MapSuppRedDecSelect(Lpk_Man_t *, unsigned int *, int, int *, int *)"
                     );
      }
      uVar10 = 0;
      do {
        if ((uVar6 >> (uVar10 & 0x1f) & 1) == 0) goto LAB_004ee7c2;
        uVar10 = uVar10 + 1;
      } while (uVar10 != 0x20);
      uVar10 = 0xffffffff;
LAB_004ee7c2:
      *local_58 = uVar10;
      *local_50 = (int)cVar1;
      return (uint)(ushort)pLVar8->uSubset0 | pLVar8->uSubset1 << 0x10;
    }
  }
  if (iVar2 == 0) {
    return 0;
  }
LAB_004ee7e7:
  puts("Could not select a subset.");
  return 0;
}

Assistant:

unsigned Lpk_MapSuppRedDecSelect( Lpk_Man_t * p, unsigned * pTruth, int nVars, int * piVar, int * piVarReused )
{
    static int nStoreSize = 256;
    static Lpk_Set_t pStore[256], * pSet, * pSetBest;
    Kit_DsdNtk_t * ppNtks[2], * pTemp;
    Vec_Int_t * vSets0 = p->vSets[0];
    Vec_Int_t * vSets1 = p->vSets[1];
    unsigned * pCof0 = (unsigned *)Vec_PtrEntry( p->vTtNodes, 0 );
    unsigned * pCof1 = (unsigned *)Vec_PtrEntry( p->vTtNodes, 1 );
    int nSets, i, SizeMax;//, SRedMax;
    unsigned Entry;
    int fVerbose = p->pPars->fVeryVerbose;
//    int fVerbose = 0;

    // collect decomposable subsets for each pair of cofactors
    if ( fVerbose )
    {
        printf( "\nExploring support-reducing bound-sets of function:\n" );
        Kit_DsdPrintFromTruth( pTruth, nVars );
    }
    nSets = 0;
    for ( i = 0; i < nVars; i++ )
    {
        if ( fVerbose )
        printf( "Evaluating variable %c:\n", 'a'+i );
        // evaluate the cofactor pair
        Kit_TruthCofactor0New( pCof0, pTruth, nVars, i );
        Kit_TruthCofactor1New( pCof1, pTruth, nVars, i );
        // decompose and expand
        ppNtks[0] = Kit_DsdDecompose( pCof0, nVars );
        ppNtks[1] = Kit_DsdDecompose( pCof1, nVars );
        ppNtks[0] = Kit_DsdExpand( pTemp = ppNtks[0] );      Kit_DsdNtkFree( pTemp );
        ppNtks[1] = Kit_DsdExpand( pTemp = ppNtks[1] );      Kit_DsdNtkFree( pTemp );
        if ( fVerbose )
        Kit_DsdPrint( stdout, ppNtks[0] );
        if ( fVerbose )
        Kit_DsdPrint( stdout, ppNtks[1] );
        // compute subsets
        Lpk_ComputeSets( ppNtks[0], vSets0 );
        Lpk_ComputeSets( ppNtks[1], vSets1 );
        // print subsets
        if ( fVerbose )
        Lpk_PrintSets( vSets0 );
        if ( fVerbose )
        Lpk_PrintSets( vSets1 );
        // free the networks
        Kit_DsdNtkFree( ppNtks[0] );
        Kit_DsdNtkFree( ppNtks[1] );
        // evaluate the pair
        Lpk_ComposeSets( vSets0, vSets1, nVars, i, pStore, &nSets, nStoreSize );
    }

    // print the results
    if ( fVerbose )
    printf( "\n" );
    if ( fVerbose )
    for ( i = 0; i < nSets; i++ )
        Lpk_MapSuppPrintSet( pStore + i, i );

    // choose the best subset
    SizeMax = 0;
    pSetBest = NULL;
    for ( i = 0; i < nSets; i++ )
    {
        pSet = pStore + i;
        if ( pSet->Size > p->pPars->nLutSize - 1 )
            continue;
        if ( SizeMax < pSet->Size )
        {
            pSetBest = pSet;
            SizeMax = pSet->Size;
        }
    }
/*
    // if the best is not choosen, select the one with largest reduction
    SRedMax = 0;
    if ( pSetBest == NULL )
    {
        for ( i = 0; i < nSets; i++ )
        {
            pSet = pStore + i;
            if ( SRedMax < pSet->SRed )
            {
                pSetBest = pSet;
                SRedMax = pSet->SRed;
            }
        }
    }
*/
    if ( pSetBest == NULL )
    {
        if ( fVerbose )
        printf( "Could not select a subset.\n" );
        return 0;
    }
    else
    {
        if ( fVerbose )
        printf( "Selected the following subset:\n" );
        if ( fVerbose )
        Lpk_MapSuppPrintSet( pSetBest, pSetBest - pStore );
    }

    // prepare the return result
    // get the remaining variables
    Entry = ((pSetBest->uSubset0 >> 16) | (pSetBest->uSubset1 >> 16));
    // get the variables to be removed
    Entry = Kit_BitMask(nVars) & ~(1<<pSetBest->iVar) & ~Entry;
    // make sure there are some - otherwise it is not supp-red
    assert( Entry );
    // remember the first such variable
    *piVarReused = Kit_WordFindFirstBit( Entry );
    *piVar = pSetBest->iVar;
    return (pSetBest->uSubset1 << 16) | (pSetBest->uSubset0 & 0xFFFF);
}